

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utmpset.c
# Opt level: O1

int main(int argc,char **argv,char **envp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  progname = *argv;
  iVar2 = sgetoptmine(argc,argv,"wV");
  bVar1 = true;
  if (iVar2 != subgetoptdone) {
    bVar1 = false;
    do {
      if (iVar2 == 0x3f) {
LAB_001025ac:
        strerr_die(1,"usage: ",progname," [-w] line","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
      }
      else {
        if (iVar2 == 0x56) {
          strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                      (strerr *)0x0);
          goto LAB_001025ac;
        }
        if (iVar2 == 0x77) {
          bVar1 = true;
        }
      }
      iVar2 = sgetoptmine(argc,argv,"wV");
    } while (iVar2 != subgetoptdone);
    bVar1 = !bVar1;
  }
  lVar3 = (long)subgetoptind;
  if (argv[lVar3] == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-w] line","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  iVar2 = utmp_logout(argv[lVar3]);
  if (iVar2 == -1) {
    strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",argv[lVar3],
               " in utmp: no such entry",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  if (!bVar1) {
    iVar2 = wtmp_logout(argv[lVar3]);
    if (iVar2 == -1) {
      strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",argv[lVar3]," in wtmp: ",
                 (char *)0x0,(char *)0x0,&strerr_sys);
    }
  }
  _exit(0);
}

Assistant:

int main (int argc, const char * const *argv, const char * const *envp) {
  int opt;
  int wtmp =0;

  progname =*argv;

  while ((opt =getopt(argc, argv, "wV")) != opteof) {
    switch(opt) {
    case 'w':
      wtmp =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;

  if (! argv || ! *argv) usage();
  if (utmp_logout(*argv) == -1)
    strerr_die4x(111, WARNING, "unable to logout line ", *argv,
                 " in utmp: no such entry");
  if (wtmp)
    if (wtmp_logout(*argv) == -1)
      strerr_die4sys(111, WARNING,
                     "unable to logout line ", *argv, " in wtmp: ");
  _exit(0);
}